

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Signal_PDU::~Signal_PDU(Signal_PDU *this)

{
  Signal_PDU *this_local;
  
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Signal_PDU_003327c0;
  std::vector<char,_std::allocator<char>_>::clear(&this->m_vData);
  std::vector<char,_std::allocator<char>_>::~vector(&this->m_vData);
  DATA_TYPE::EncodingScheme::~EncodingScheme(&this->m_EncodingScheme);
  Radio_Communications_Header::~Radio_Communications_Header
            (&this->super_Radio_Communications_Header);
  return;
}

Assistant:

Signal_PDU::~Signal_PDU()
{
    m_vData.clear();
}